

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.hpp
# Opt level: O0

void __thiscall
tf::Executor::_tear_down_dependent_async(Executor *this,Worker *worker,Node *node,Node **cache)

{
  Node *pNVar1;
  Worker *pWVar2;
  reference ppNVar3;
  long *in_RCX;
  void *in_RDX;
  undefined8 in_RSI;
  Node *s;
  size_t i;
  underlying_type target;
  add_pointer_t<tf::Node::DependentAsync> handle;
  size_type in_stack_fffffffffffffe48;
  SmallVectorTemplateCommon<tf::Node_*,_void> *in_stack_fffffffffffffe50;
  Executor *this_00;
  Worker *worker_00;
  Executor *in_stack_fffffffffffffe80;
  Worker *local_d8;
  undefined4 local_cc;
  add_pointer_t<tf::Node::DependentAsync> local_c8;
  long *local_c0;
  void *local_b8;
  undefined8 local_b0;
  __int_type_conflict1 local_a0;
  undefined8 local_98;
  undefined4 local_8c;
  undefined8 local_88;
  atomic<unsigned_long> *local_80;
  __int_type_conflict1 local_78;
  undefined8 local_70;
  undefined4 local_64;
  undefined8 local_60;
  atomic<unsigned_long> *local_58;
  Node *local_50;
  long *local_48;
  undefined8 local_40;
  void *local_30;
  undefined1 local_21;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 *local_10;
  atomic<int> *local_8;
  
  local_c0 = in_RCX;
  local_b8 = in_RDX;
  local_b0 = in_RSI;
  local_c8 = std::
             get_if<tf::Node::DependentAsync,std::monostate,tf::Node::Static,tf::Node::Runtime,tf::Node::Subflow,tf::Node::Condition,tf::Node::MultiCondition,tf::Node::Module,tf::Node::Async,tf::Node::DependentAsync>
                       ((variant<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                         *)0x16228b);
  do {
    local_cc = 0;
    local_8 = &local_c8->state;
    local_10 = &local_cc;
    local_14 = 2;
    local_18 = 4;
    local_1c = 0;
    local_20 = 2;
    LOCK();
    local_21 = (local_8->super___atomic_base<int>)._M_i == 0;
    if ((bool)local_21) {
      (local_8->super___atomic_base<int>)._M_i = 2;
    }
    UNLOCK();
  } while (!(bool)local_21);
  local_d8 = (Worker *)0x0;
  while (worker_00 = local_d8,
        pWVar2 = (Worker *)
                 SmallVectorTemplateCommon<tf::Node_*,_void>::size(in_stack_fffffffffffffe50),
        worker_00 < pWVar2) {
    ppNVar3 = SmallVectorTemplateCommon<tf::Node_*,_void>::operator[]
                        (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    pNVar1 = *ppNVar3;
    local_58 = &pNVar1->_join_counter;
    local_60 = 1;
    local_64 = 4;
    local_70 = 1;
    LOCK();
    local_78 = (local_58->super___atomic_base<unsigned_long>)._M_i;
    (local_58->super___atomic_base<unsigned_long>)._M_i =
         (local_58->super___atomic_base<unsigned_long>)._M_i - 1;
    UNLOCK();
    if (local_78 == 1) {
      local_40 = local_b0;
      local_48 = local_c0;
      local_50 = pNVar1;
      if (*local_c0 != 0) {
        _schedule(in_stack_fffffffffffffe80,worker_00,(Node *)0x3);
      }
      *local_48 = (long)local_50;
    }
    local_d8 = (Worker *)&local_d8->field_0x1;
  }
  this_00 = (Executor *)&local_c8->use_count;
  local_88 = 1;
  local_8c = 4;
  local_98 = 1;
  LOCK();
  local_a0 = (((atomic<unsigned_long> *)this_00)->super___atomic_base<unsigned_long>)._M_i;
  (((atomic<unsigned_long> *)this_00)->super___atomic_base<unsigned_long>)._M_i =
       (((atomic<unsigned_long> *)this_00)->super___atomic_base<unsigned_long>)._M_i - 1;
  UNLOCK();
  local_80 = (atomic<unsigned_long> *)this_00;
  if ((local_a0 == 1) && (local_30 = local_b8, local_b8 != (void *)0x0)) {
    Node::~Node((Node *)this_00);
    operator_delete(local_b8,0xd8);
  }
  _decrement_topology(this_00);
  return;
}

Assistant:

inline void Executor::_tear_down_dependent_async(Worker& worker, Node* node, Node*& cache) {

  auto handle = std::get_if<Node::DependentAsync>(&(node->_handle));

  // this async task comes from Executor
  auto target = ASTATE::UNFINISHED;

  while(!handle->state.compare_exchange_weak(target, ASTATE::FINISHED,
                                             std::memory_order_acq_rel,
                                             std::memory_order_relaxed)) {
    target = ASTATE::UNFINISHED;
  }
  
  // spawn successors whenever their dependencies are resolved
  for(size_t i=0; i<node->_edges.size(); ++i) {
    if(auto s = node->_edges[i]; 
      s->_join_counter.fetch_sub(1, std::memory_order_acq_rel) == 1
    ) {
      _update_cache(worker, cache, s);
    }
  }
  
  // now the executor no longer needs to retain ownership
  if(handle->use_count.fetch_sub(1, std::memory_order_acq_rel) == 1) {
    recycle(node);
  }

  _decrement_topology();
}